

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftForestNoNZ
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *vec)

{
  long lVar1;
  int iVar2;
  int iVar3;
  fpclass_type fVar4;
  pointer pnVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int32_t iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  int *piVar18;
  byte bVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar19 = 0;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  iVar2 = (this->l).firstUpdate;
  iVar10 = (this->l).firstUnused;
  if (iVar2 < iVar10) {
    pnVar5 = (this->l).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar6 = (this->l).idx;
    piVar7 = (this->l).row;
    piVar8 = (this->l).start;
    lVar12 = (long)iVar10;
    do {
      lVar1 = lVar12 + -1;
      iVar10 = piVar7[lVar12 + -1];
      pnVar14 = vec + iVar10;
      pcVar16 = &local_b8;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pcVar16->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar19 * -2 + 1) * 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      local_b8.exp = vec[iVar10].m_backend.exp;
      local_b8.neg = vec[iVar10].m_backend.neg;
      fVar4 = vec[iVar10].m_backend.fpclass;
      iVar9 = vec[iVar10].m_backend.prec_elem;
      local_b8.fpclass = fVar4;
      local_b8.prec_elem = iVar9;
      if (fVar4 == cpp_dec_float_NaN) {
LAB_0054b1e2:
        iVar10 = piVar8[lVar1];
        iVar13 = piVar8[lVar12];
        if (iVar10 < iVar13) {
          piVar18 = piVar6 + iVar10;
          pcVar16 = &pnVar5[iVar10].m_backend;
          do {
            local_138.fpclass = cpp_dec_float_finite;
            local_138.prec_elem = 0x1c;
            local_138.data._M_elems[0] = 0;
            local_138.data._M_elems[1] = 0;
            local_138.data._M_elems[2] = 0;
            local_138.data._M_elems[3] = 0;
            local_138.data._M_elems[4] = 0;
            local_138.data._M_elems[5] = 0;
            local_138.data._M_elems[6] = 0;
            local_138.data._M_elems[7] = 0;
            local_138.data._M_elems[8] = 0;
            local_138.data._M_elems[9] = 0;
            local_138.data._M_elems[10] = 0;
            local_138.data._M_elems[0xb] = 0;
            local_138.data._M_elems[0xc] = 0;
            local_138.data._M_elems[0xd] = 0;
            local_138.data._M_elems[0xe] = 0;
            local_138.data._M_elems[0xf] = 0;
            local_138.data._M_elems[0x10] = 0;
            local_138.data._M_elems[0x11] = 0;
            local_138.data._M_elems[0x12] = 0;
            local_138.data._M_elems[0x13] = 0;
            local_138.data._M_elems[0x14] = 0;
            local_138.data._M_elems[0x15] = 0;
            local_138.data._M_elems[0x16] = 0;
            local_138.data._M_elems[0x17] = 0;
            local_138.data._M_elems[0x18] = 0;
            local_138.data._M_elems[0x19] = 0;
            local_138.data._M_elems._104_5_ = 0;
            local_138.data._M_elems[0x1b]._1_3_ = 0;
            local_138.exp = 0;
            local_138.neg = false;
            pcVar15 = &local_b8;
            if (pcVar16 != &local_138) {
              pcVar17 = &local_138;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pcVar17->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
                pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar19 * -8 + 4)
                ;
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar19 * -8 + 4)
                ;
              }
              local_138.exp = local_b8.exp;
              local_138.neg = local_b8.neg;
              local_138.fpclass = local_b8.fpclass;
              local_138.prec_elem = local_b8.prec_elem;
              pcVar15 = pcVar16;
            }
            pcVar16 = pcVar16 + 1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_138,pcVar15);
            iVar3 = *piVar18;
            piVar18 = piVar18 + 1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&vec[iVar3].m_backend,&local_138);
            iVar13 = iVar13 + -1;
          } while (iVar10 < iVar13);
        }
      }
      else {
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 0x1c;
        local_138.data._M_elems[0] = 0;
        local_138.data._M_elems[1] = 0;
        local_138.data._M_elems[2] = 0;
        local_138.data._M_elems[3] = 0;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems[6] = 0;
        local_138.data._M_elems[7] = 0;
        local_138.data._M_elems[8] = 0;
        local_138.data._M_elems[9] = 0;
        local_138.data._M_elems[10] = 0;
        local_138.data._M_elems[0xb] = 0;
        local_138.data._M_elems[0xc] = 0;
        local_138.data._M_elems[0xd] = 0;
        local_138.data._M_elems[0xe] = 0;
        local_138.data._M_elems[0xf] = 0;
        local_138.data._M_elems[0x10] = 0;
        local_138.data._M_elems[0x11] = 0;
        local_138.data._M_elems[0x12] = 0;
        local_138.data._M_elems[0x13] = 0;
        local_138.data._M_elems[0x14] = 0;
        local_138.data._M_elems[0x15] = 0;
        local_138.data._M_elems[0x16] = 0;
        local_138.data._M_elems[0x17] = 0;
        local_138.data._M_elems[0x18] = 0;
        local_138.data._M_elems[0x19] = 0;
        local_138.data._M_elems._104_5_ = 0;
        local_138.data._M_elems[0x1b]._1_3_ = 0;
        local_138.exp = 0;
        local_138.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_138,0.0);
        iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_b8,&local_138);
        if (iVar10 != 0) goto LAB_0054b1e2;
      }
      lVar12 = lVar1;
    } while (iVar2 < lVar1);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleftForestNoNZ(R* vec)
{
   int i, j, k, end;
   R x;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         assert(i >= 0 && i < l.size);
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            vec[*idx++] -= x * (*val++);
         }
      }
   }
}